

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalGenerator::IsExcluded(cmGlobalGenerator *this,cmLocalGenerator *root,cmLocalGenerator *gen)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  string local_50;
  
  if (gen == root || gen == (cmLocalGenerator *)0x0) {
    bVar2 = false;
  }
  else {
    this_00 = gen->Makefile;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"EXCLUDE_FROM_ALL","");
    bVar1 = cmMakefile::GetPropertyAsBool(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = true;
    if (!bVar1) {
      bVar2 = IsExcluded(this,root,gen->Parent);
    }
  }
  return bVar2;
}

Assistant:

bool cmGlobalGenerator::IsExcluded(cmLocalGenerator* root,
                                   cmLocalGenerator* gen) const
{
  if(!gen || gen == root)
    {
    // No directory excludes itself.
    return false;
    }

  if(gen->GetMakefile()->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
    {
    // This directory is excluded from its parent.
    return true;
    }

  // This directory is included in its parent.  Check whether the
  // parent is excluded.
  return this->IsExcluded(root, gen->GetParent());
}